

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O3

void __thiscall FParser::SF_SpawnShot2(FParser *this)

{
  svalue_t *psVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  AActor *pAVar5;
  PClassActor *type;
  AActor *ent;
  AActor *pAVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  FSoundID local_54;
  svalue_t local_50;
  DVector3 local_38;
  
  iVar4 = this->t_argc;
  if (iVar4 < 2) {
    script_error("Insufficient parameters for \'%s\'\n",(this->t_func).Chars);
    return;
  }
  psVar1 = this->t_argv;
  if ((psVar1[1].type == 1) && (psVar1[1].value.i < 0)) {
    pAVar5 = (this->Script->trigger).field_0.p;
    if (pAVar5 != (AActor *)0x0) {
      if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_006acb76;
      (this->Script->trigger).field_0.p = (AActor *)0x0;
    }
    pAVar5 = (AActor *)0x0;
  }
  else {
    pAVar5 = actorvalue(psVar1 + 1);
    iVar4 = this->t_argc;
  }
LAB_006acb76:
  uVar7 = 0;
  uVar8 = 0;
  if (2 < iVar4) {
    dVar2 = floatvalue(this->t_argv + 2);
    uVar7 = SUB84(dVar2,0);
    uVar8 = (undefined4)((ulong)dVar2 >> 0x20);
  }
  if (pAVar5 != (AActor *)0x0) {
    svalue_t::svalue_t(&local_50,this->t_argv);
    type = T_GetMobjType(&local_50);
    FString::~FString(&local_50.string);
    if (type != (PClassActor *)0x0) {
      (this->t_return).type = 2;
      local_38.Z = (double)CONCAT44(uVar8,uVar7) + (pAVar5->__Pos).Z;
      local_38.X = (pAVar5->__Pos).X;
      local_38.Y = (pAVar5->__Pos).Y;
      ent = AActor::StaticSpawn(type,&local_38,ALLOW_REPLACE,false);
      pAVar6 = (AActor *)0x0;
      if (ent != (AActor *)0x0) {
        local_54.ID = (ent->SeeSound).super_FSoundID.ID;
        S_Sound(ent,2,&local_54,1.0,1.0);
        (ent->target).field_0.p = pAVar5;
        (ent->Angles).Yaw.Degrees = (pAVar5->Angles).Yaw.Degrees;
        AActor::Thrust(ent);
        bVar3 = P_CheckMissileSpawn(ent,pAVar5->radius);
        pAVar6 = (AActor *)0x0;
        if (bVar3) {
          pAVar6 = ent;
        }
      }
      (this->t_return).value.mobj = pAVar6;
    }
  }
  return;
}

Assistant:

void FParser::SF_SpawnShot2(void)
{
	AActor *source = NULL;
	PClassActor * pclass;
	double z = 0;

	// t_argv[0] = type to spawn
	// t_argv[1] = source mobj, optional, -1 to default
	// shoots at source's angle

	if (CheckArgs(2))
	{
		if (t_argv[1].type == svt_int && t_argv[1].value.i < 0)
			source = Script->trigger;
		else
			source = actorvalue(t_argv[1]);

		if (t_argc > 2) z = floatvalue(t_argv[2]);

		if (!source)	return;

		if (!(pclass = T_GetMobjType(t_argv[0]))) return;

		t_return.type = svt_mobj;

		AActor *mo = Spawn(pclass, source->PosPlusZ(z), ALLOW_REPLACE);
		if (mo)
		{
			S_Sound(mo, CHAN_VOICE, mo->SeeSound, 1, ATTN_NORM);
			mo->target = source;
			mo->Angles.Yaw = source->Angles.Yaw;
			mo->Thrust();
			if (!P_CheckMissileSpawn(mo, source->radius)) mo = NULL;
		}
		t_return.value.mobj = mo;
	}
}